

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

enet_uint32 reflect_crc(int val,int bits)

{
  int bit;
  int result;
  int bits_local;
  int val_local;
  
  result = 0;
  val_local = val;
  for (bit = 0; bit < bits; bit = bit + 1) {
    if ((val_local & 1U) != 0) {
      result = 1 << (((char)bits + -1) - (char)bit & 0x1fU) | result;
    }
    val_local = val_local >> 1;
  }
  return result;
}

Assistant:

static enet_uint32 
reflect_crc (int val, int bits)
{
    int result = 0, bit;

    for (bit = 0; bit < bits; bit ++)
    {
        if(val & 1) result |= 1 << (bits - 1 - bit); 
        val >>= 1;
    }

    return result;
}